

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O2

feed_db_status_t store_calendar_dates_db(calendar_date_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  sqlite3_stmt *stmt;
  char qr [83];
  
  pcVar2 = "INSERT INTO calendar_dates (service_id, date, exception_type) values (?1, ?2, ?3);";
  pcVar4 = qr;
  for (lVar3 = 0x53; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pcVar4 = *pcVar2;
    pcVar2 = pcVar2 + 1;
    pcVar4 = pcVar4 + 1;
  }
  sqlite3_prepare_v2(db->conn,qr,-1,&stmt,(char **)0x0);
  sqlite3_bind_text(stmt,1,record->service_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stmt,2,record->date,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(stmt,3,record->exception_type);
  iVar1 = sqlite3_step(stmt);
  db->rc = iVar1;
  if (iVar1 != 0x65) {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  sqlite3_finalize(stmt);
  return (uint)(iVar1 == 0x65);
}

Assistant:

feed_db_status_t store_calendar_dates_db(calendar_date_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO calendar_dates ("
                    "service_id, date, exception_type"
                ") values ("
                    "?1, ?2, ?3"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->service_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->date, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 3, (int)record->exception_type);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}